

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::subIf(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *nodes;
  RefAST RVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ASTArray *pAVar5;
  NoViableAltException *pNVar6;
  AST *pAVar7;
  AST *pAVar8;
  AST *pAVar9;
  AST *pAVar10;
  RefAST tmp180_AST;
  RefAST tmp181_AST;
  RefAST tmp178_AST;
  RefAST subIf_AST;
  undefined1 local_138 [8];
  RefAST tmp179_AST;
  RefAST C3x_AST;
  RefCount<AST> local_120;
  RefAST C3_AST;
  RefCount<AST> local_110;
  RefCount<AST> local_108;
  RefCount<AST> local_100;
  RefCount<AST> local_f8;
  RefCount<AST> local_f0;
  RefCount<AST> local_e8;
  ASTFactory local_e0;
  RefCount<Token> local_d0;
  RefCount<Token> local_c8;
  RefCount<Token> local_c0;
  RefToken C3k;
  RefToken C1k;
  ASTPair currentAST;
  RefAST local_98;
  RefAST local_90;
  RefAST local_88;
  RefToken local_80;
  RefToken local_78;
  RefAST local_70;
  RefAST local_68;
  RefCount<Token> local_60;
  RefToken local_58;
  RefAST local_50;
  RefAST local_48;
  RefAST local_40;
  RefCount<Token> local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  subIf_AST = nullAST;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  C1k.ref = nullToken.ref;
  if (nullToken.ref != (Ref *)0x0) {
    (nullToken.ref)->count = (nullToken.ref)->count + 1;
  }
  if (subIf_AST.ref != (Ref *)0x0) {
    (subIf_AST.ref)->count = (subIf_AST.ref)->count + 7;
  }
  local_e8.ref = subIf_AST.ref;
  local_f0.ref = subIf_AST.ref;
  local_f8.ref = subIf_AST.ref;
  local_100.ref = subIf_AST.ref;
  local_108.ref = subIf_AST.ref;
  local_110.ref = subIf_AST.ref;
  C3_AST = subIf_AST;
  if (C1k.ref != (Ref *)0x0) {
    (C1k.ref)->count = (C1k.ref)->count + 1;
  }
  C3k = C1k;
  if (subIf_AST.ref != (Ref *)0x0) {
    (subIf_AST.ref)->count = (subIf_AST.ref)->count + 2;
  }
  local_120.ref = subIf_AST.ref;
  C3x_AST = subIf_AST;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&tmp178_AST,this,1);
  RefCount<Token>::operator=(&C1k,(RefCount<Token> *)&tmp178_AST);
  RefCount<Token>::~RefCount((RefCount<Token> *)&tmp178_AST);
  nodes = &(this->super_LLkParser).super_Parser.astFactory;
  if (C1k.ref != (Ref *)0x0) {
    (C1k.ref)->count = (C1k.ref)->count + 1;
  }
  local_38.ref = C1k.ref;
  ASTFactory::create((ASTFactory *)&tmp178_AST,(RefToken *)nodes);
  RefCount<AST>::operator=(&local_e8,&tmp178_AST);
  RefCount<AST>::~RefCount(&tmp178_AST);
  RefCount<Token>::~RefCount(&local_38);
  Parser::match((Parser *)this,0x28);
  tmp178_AST = nullAST;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_c0,this,1);
  ASTFactory::create((ASTFactory *)&tmp179_AST,(RefToken *)nodes);
  RefCount<AST>::operator=(&tmp178_AST,&tmp179_AST);
  RefCount<AST>::~RefCount(&tmp179_AST);
  RefCount<Token>::~RefCount(&local_c0);
  Parser::match((Parser *)this,6);
  expr(this);
  RefCount<AST>::operator=(&local_f0,this_00);
  tmp179_AST = nullAST;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_c8,this,1);
  ASTFactory::create((ASTFactory *)&tmp180_AST,(RefToken *)nodes);
  RefCount<AST>::operator=(&tmp179_AST,&tmp180_AST);
  RefCount<AST>::~RefCount(&tmp180_AST);
  RefCount<Token>::~RefCount(&local_c8);
  Parser::match((Parser *)this,7);
  subEntryList(this);
  RefCount<AST>::operator=(&local_100,this_00);
  pAVar5 = (ASTArray *)operator_new(0x20);
  ASTArray::ASTArray(pAVar5,3);
  if (local_e8.ref != (Ref *)0x0) {
    (local_e8.ref)->count = (local_e8.ref)->count + 1;
  }
  local_40.ref = local_e8.ref;
  pAVar5 = ASTArray::add(pAVar5,&local_40);
  if (local_f0.ref != (Ref *)0x0) {
    (local_f0.ref)->count = (local_f0.ref)->count + 1;
  }
  local_48.ref = local_f0.ref;
  pAVar5 = ASTArray::add(pAVar5,&local_48);
  if (local_100.ref != (Ref *)0x0) {
    (local_100.ref)->count = (local_100.ref)->count + 1;
  }
  local_50.ref = local_100.ref;
  ASTArray::add(pAVar5,&local_50);
  ASTFactory::make((ASTFactory *)&tmp180_AST,(ASTArray *)nodes);
  RefCount<AST>::operator=(&local_f8,&tmp180_AST);
  RefCount<AST>::~RefCount(&tmp180_AST);
  RefCount<AST>::~RefCount(&local_50);
  RefCount<AST>::~RefCount(&local_48);
  RefCount<AST>::~RefCount(&local_40);
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 < 0x29) {
LAB_0017c5d2:
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar3 != 0x29) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      if (iVar3 != 0x2a) goto LAB_0017cb1b;
    }
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar2 = BitSet::member(&_tokenSet_48,iVar3);
    if (!bVar2) {
LAB_0017cb1b:
      pNVar6 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_58,this,1);
      NoViableAltException::NoViableAltException(pNVar6,&local_58);
      __cxa_throw(pNVar6,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
    bVar2 = BitSet::member(&_tokenSet_4,iVar3);
    if (!bVar2) goto LAB_0017cb1b;
  }
  else {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (0x2c < iVar3) goto LAB_0017c5d2;
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar2 = BitSet::member(&_tokenSet_48,iVar3);
    if (!bVar2) goto LAB_0017c5d2;
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
    bVar2 = BitSet::member(&_tokenSet_4,iVar3);
    if (!bVar2) goto LAB_0017c5d2;
    subElseIfList(this);
    RefCount<AST>::operator=(&local_110,this_00);
    RefCount<AST>::operator=(&local_108,&local_110);
  }
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 != 0x2a) {
    if (iVar3 != 0x29) {
      pNVar6 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
      NoViableAltException::NoViableAltException(pNVar6,&local_78);
      __cxa_throw(pNVar6,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&tmp180_AST,this,1);
    RefCount<Token>::operator=(&C3k,(RefCount<Token> *)&tmp180_AST);
    RefCount<Token>::~RefCount((RefCount<Token> *)&tmp180_AST);
    if (C3k.ref != (Ref *)0x0) {
      (C3k.ref)->count = (C3k.ref)->count + 1;
    }
    local_60.ref = C3k.ref;
    ASTFactory::create((ASTFactory *)&tmp180_AST,(RefToken *)nodes);
    RefCount<AST>::operator=(&local_120,&tmp180_AST);
    RefCount<AST>::~RefCount(&tmp180_AST);
    RefCount<Token>::~RefCount(&local_60);
    Parser::match((Parser *)this,0x29);
    subEntryList(this);
    RefCount<AST>::operator=(&C3x_AST,this_00);
    pAVar5 = (ASTArray *)operator_new(0x20);
    ASTArray::ASTArray(pAVar5,2);
    if (local_120.ref != (Ref *)0x0) {
      (local_120.ref)->count = (local_120.ref)->count + 1;
    }
    local_68.ref = local_120.ref;
    pAVar5 = ASTArray::add(pAVar5,&local_68);
    if (C3x_AST.ref != (Ref *)0x0) {
      (C3x_AST.ref)->count = (C3x_AST.ref)->count + 1;
    }
    local_70.ref = C3x_AST.ref;
    ASTArray::add(pAVar5,&local_70);
    ASTFactory::make((ASTFactory *)&tmp180_AST,(ASTArray *)nodes);
    RefCount<AST>::operator=(&C3_AST,&tmp180_AST);
    RefCount<AST>::~RefCount(&tmp180_AST);
    RefCount<AST>::~RefCount(&local_70);
    RefCount<AST>::~RefCount(&local_68);
  }
  tmp180_AST.ref = nullAST.ref;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_d0,this,1);
  ASTFactory::create((ASTFactory *)&tmp181_AST,(RefToken *)nodes);
  RefCount<AST>::operator=(&tmp180_AST,&tmp181_AST);
  RefCount<AST>::~RefCount(&tmp181_AST);
  RefCount<Token>::~RefCount(&local_d0);
  Parser::match((Parser *)this,0x2a);
  uVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  RVar1 = nullAST;
  if (0x35 < uVar4) {
LAB_0017cbb6:
    pNVar6 = (NoViableAltException *)__cxa_allocate_exception(0x40);
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
    NoViableAltException::NoViableAltException(pNVar6,&local_80);
    __cxa_throw(pNVar6,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
  if ((0x2d1fc0fc00e640U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
    if ((ulong)uVar4 != 8) goto LAB_0017cbb6;
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    tmp181_AST = RVar1;
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_e0.nodeFactory,this,1);
    ASTFactory::create((ASTFactory *)local_138,(RefToken *)nodes);
    RefCount<AST>::operator=(&tmp181_AST,(RefCount<AST> *)local_138);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_138);
    RefCount<Token>::~RefCount((RefCount<Token> *)&local_e0.nodeFactory);
    Parser::match((Parser *)this,8);
    RefCount<AST>::~RefCount(&tmp181_AST);
  }
  RefCount<AST>::operator=(&subIf_AST,&currentAST.root);
  pAVar5 = (ASTArray *)operator_new(0x20);
  ASTArray::ASTArray(pAVar5,4);
  ASTFactory::create(&local_e0,(int)nodes);
  pAVar5 = ASTArray::add(pAVar5,(RefAST *)&local_e0);
  if (local_f8.ref != (Ref *)0x0) {
    (local_f8.ref)->count = (local_f8.ref)->count + 1;
  }
  local_88.ref = local_f8.ref;
  pAVar5 = ASTArray::add(pAVar5,&local_88);
  if (local_108.ref != (Ref *)0x0) {
    (local_108.ref)->count = (local_108.ref)->count + 1;
  }
  local_90.ref = local_108.ref;
  pAVar5 = ASTArray::add(pAVar5,&local_90);
  if (C3_AST.ref != (Ref *)0x0) {
    (C3_AST.ref)->count = (C3_AST.ref)->count + 1;
  }
  local_98.ref = C3_AST.ref;
  ASTArray::add(pAVar5,&local_98);
  ASTFactory::make((ASTFactory *)&tmp181_AST,(ASTArray *)nodes);
  RefCount<AST>::operator=(&subIf_AST,&tmp181_AST);
  RefCount<AST>::~RefCount(&tmp181_AST);
  RefCount<AST>::~RefCount(&local_98);
  RefCount<AST>::~RefCount(&local_90);
  RefCount<AST>::~RefCount(&local_88);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_e0);
  RefCount<AST>::operator=(&currentAST.root,&subIf_AST);
  if (subIf_AST.ref == (Ref *)0x0) {
    pAVar10 = (AST *)0x0;
  }
  else {
    pAVar10 = (subIf_AST.ref)->ptr;
  }
  if (nullAST.ref == (Ref *)0x0) {
    pAVar9 = (AST *)0x0;
  }
  else {
    pAVar9 = (nullAST.ref)->ptr;
  }
  if (pAVar10 != pAVar9) {
    AST::getFirstChild((subIf_AST.ref)->ptr);
    if (local_138 == (undefined1  [8])0x0) {
      pAVar7 = (AST *)0x0;
    }
    else {
      pAVar7 = *(AST **)local_138;
    }
    if (nullAST.ref == (Ref *)0x0) {
      pAVar8 = (AST *)0x0;
    }
    else {
      pAVar8 = (nullAST.ref)->ptr;
    }
    if (pAVar7 != pAVar8) {
      AST::getFirstChild((subIf_AST.ref)->ptr);
      goto LAB_0017c99a;
    }
  }
  if (subIf_AST.ref != (Ref *)0x0) {
    (subIf_AST.ref)->count = (subIf_AST.ref)->count + 1;
  }
  tmp181_AST = subIf_AST;
LAB_0017c99a:
  RefCount<AST>::operator=(&currentAST.child,&tmp181_AST);
  RefCount<AST>::~RefCount(&tmp181_AST);
  if (pAVar10 != pAVar9) {
    RefCount<AST>::~RefCount((RefCount<AST> *)local_138);
  }
  ASTPair::advanceChildToEnd(&currentAST);
  RefCount<AST>::~RefCount(&tmp180_AST);
  RefCount<AST>::~RefCount(&tmp179_AST);
  RefCount<AST>::~RefCount(&tmp178_AST);
  RefCount<AST>::operator=(this_00,&subIf_AST);
  RefCount<AST>::~RefCount(&C3x_AST);
  RefCount<AST>::~RefCount(&local_120);
  RefCount<Token>::~RefCount(&C3k);
  RefCount<AST>::~RefCount(&C3_AST);
  RefCount<AST>::~RefCount(&local_110);
  RefCount<AST>::~RefCount(&local_108);
  RefCount<AST>::~RefCount(&local_100);
  RefCount<AST>::~RefCount(&local_f8);
  RefCount<AST>::~RefCount(&local_f0);
  RefCount<AST>::~RefCount(&local_e8);
  RefCount<Token>::~RefCount(&C1k);
  RefCount<AST>::~RefCount(&subIf_AST);
  ASTPair::~ASTPair(&currentAST);
  return;
}

Assistant:

void GrpParser::subIf() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST subIf_AST = nullAST;
	RefToken  C1k = nullToken;
	RefAST C1k_AST = nullAST;
	RefAST E_AST = nullAST;
	RefAST C1_AST = nullAST;
	RefAST C1x_AST = nullAST;
	RefAST C2_AST = nullAST;
	RefAST C2x_AST = nullAST;
	RefAST C3_AST = nullAST;
	RefToken  C3k = nullToken;
	RefAST C3k_AST = nullAST;
	RefAST C3x_AST = nullAST;
	
	try {      // for error handling
		C1k = LT(1);
		C1k_AST = astFactory.create(C1k);
		match(LITERAL_if);
		RefAST tmp178_AST = nullAST;
		tmp178_AST = astFactory.create(LT(1));
		match(OP_LPAREN);
		expr();
		E_AST = returnAST;
		RefAST tmp179_AST = nullAST;
		tmp179_AST = astFactory.create(LT(1));
		match(OP_RPAREN);
		{
		subEntryList();
		C1x_AST = returnAST;
		C1_AST = astFactory.make( (new ASTArray(3))->add(C1k_AST)->add(E_AST)->add(C1x_AST));
		}
		{
		if (((LA(1) >= LITERAL_else && LA(1) <= LITERAL_elseif)) && (_tokenSet_48.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			subElseIfList();
			C2x_AST = returnAST;
			C2_AST = C2x_AST;
		}
		else if ((LA(1)==LITERAL_else||LA(1)==LITERAL_endif) && (_tokenSet_48.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		{
		switch ( LA(1)) {
		case LITERAL_else:
		{
			C3k = LT(1);
			C3k_AST = astFactory.create(C3k);
			match(LITERAL_else);
			subEntryList();
			C3x_AST = returnAST;
			C3_AST = astFactory.make( (new ASTArray(2))->add(C3k_AST)->add(C3x_AST));
			break;
		}
		case LITERAL_endif:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp180_AST = nullAST;
		tmp180_AST = astFactory.create(LT(1));
		match(LITERAL_endif);
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp181_AST = nullAST;
			tmp181_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case OP_LPAREN:
		case LITERAL_environment:
		case LITERAL_endenvironment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		case LITERAL_pseudo:
		case LIT_UHEX:
		case LITERAL_codepoint:
		case LITERAL_glyphid:
		case LITERAL_postscript:
		case LITERAL_unicode:
		case LITERAL_pass:
		case LITERAL_endpass:
		case LITERAL_if:
		case LITERAL_else:
		case LITERAL_endif:
		case Zelseif:
		case LITERAL_elseif:
		case OP_LBRACKET:
		case OP_UNDER:
		case OP_AT:
		case OP_HASH:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		subIf_AST = currentAST.root;
		subIf_AST = astFactory.make( (new ASTArray(4))->add(astFactory.create(ZifStruct))->add(C1_AST)->add(C2_AST)->add(C3_AST));
		currentAST.root = subIf_AST;
		currentAST.child = subIf_AST!=nullAST &&subIf_AST->getFirstChild()!=nullAST ?
			subIf_AST->getFirstChild() : subIf_AST;
		currentAST.advanceChildToEnd();
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_47);
	}
	returnAST = subIf_AST;
}